

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::MedianFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  LogicalType LStack_1a8;
  LogicalType local_190;
  LogicalType local_178;
  string local_160;
  AggregateFunction local_140;
  
  ::std::__cxx11::string::string((string *)&local_160,"median",(allocator *)&LStack_1a8);
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_160);
  ::std::__cxx11::string::~string((string *)&local_160);
  LogicalType::LogicalType(&local_178,ANY);
  LogicalType::LogicalType(&local_190,ANY);
  LogicalType::LogicalType(&LStack_1a8,INVALID);
  EmptyQuantileFunction<duckdb::MedianFunction>(&local_140,&local_178,&local_190,&LStack_1a8);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  LogicalType::~LogicalType(&LStack_1a8);
  LogicalType::~LogicalType(&local_190);
  LogicalType::~LogicalType(&local_178);
  return in_RDI;
}

Assistant:

AggregateFunctionSet MedianFun::GetFunctions() {
	AggregateFunctionSet set("median");
	set.AddFunction(EmptyQuantileFunction<MedianFunction>(LogicalType::ANY, LogicalType::ANY, LogicalTypeId::INVALID));
	return set;
}